

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall
ON_RTree::InsertRectRec
          (ON_RTree *this,ON_RTreeBBox *a_rect,ON__INT_PTR a_id,ON_RTreeNode *a_node,
          ON_RTreeNode **a_newNode,int a_level)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ON_RTreeBBox *pOVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_b8;
  ON_RTreeNode *otherNode;
  ON_RTreeBranch local_68;
  
  if (a_level < a_node->m_level) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)a_node->m_count;
    if (a_node->m_count < 1) {
      uVar4 = uVar3;
    }
    bVar2 = 1;
    uVar5 = 0xffffffffffffffff;
    dVar9 = -1.0;
    local_b8 = -1.0;
    pOVar6 = &a_node->m_branch[0].m_rect;
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dVar7 = CalcRectVolumeHelper(pOVar6);
      CombineRectHelper(&local_68.m_rect,a_rect,pOVar6);
      dVar8 = ((local_68.m_rect.m_max[2] - local_68.m_rect.m_min[2]) *
               (local_68.m_rect.m_max[2] - local_68.m_rect.m_min[2]) +
              (local_68.m_rect.m_max[1] - local_68.m_rect.m_min[1]) *
              (local_68.m_rect.m_max[1] - local_68.m_rect.m_min[1]) +
              (local_68.m_rect.m_max[0] - local_68.m_rect.m_min[0]) *
              (local_68.m_rect.m_max[0] - local_68.m_rect.m_min[0])) - dVar7;
      if ((bool)(~bVar2 & dVar9 <= dVar8)) {
        if (((dVar8 == dVar9) && (!NAN(dVar8) && !NAN(dVar9))) && (dVar7 <= local_b8))
        goto LAB_005b31a0;
      }
      else {
LAB_005b31a0:
        uVar5 = uVar3 & 0xffffffff;
        dVar9 = dVar8;
        local_b8 = dVar7;
      }
      pOVar6 = (ON_RTreeBBox *)(pOVar6[1].m_min + 1);
      bVar2 = 0;
    }
    if (-1 < (int)uVar5) {
      pOVar6 = &a_node->m_branch[uVar5 & 0xffffffff].m_rect;
      bVar1 = InsertRectRec(this,a_rect,a_id,a_node->m_branch[uVar5 & 0xffffffff].field_1.m_child,
                            &otherNode,a_level);
      if (bVar1) {
        NodeCover(&local_68.m_rect,(ON_RTreeNode *)pOVar6[1].m_min[0]);
        pOVar6->m_max[1] = local_68.m_rect.m_max[1];
        pOVar6->m_max[2] = local_68.m_rect.m_max[2];
        pOVar6->m_min[2] = local_68.m_rect.m_min[2];
        pOVar6->m_max[0] = local_68.m_rect.m_max[0];
        pOVar6->m_min[0] = local_68.m_rect.m_min[0];
        pOVar6->m_min[1] = local_68.m_rect.m_min[1];
        local_68.field_1.m_child = otherNode;
        NodeCover(&local_68.m_rect,otherNode);
        goto LAB_005b3291;
      }
      CombineRectHelper(&local_68.m_rect,a_rect,pOVar6);
      pOVar6->m_max[1] = local_68.m_rect.m_max[1];
      pOVar6->m_max[2] = local_68.m_rect.m_max[2];
      pOVar6->m_min[2] = local_68.m_rect.m_min[2];
      pOVar6->m_max[0] = local_68.m_rect.m_max[0];
      pOVar6->m_min[0] = local_68.m_rect.m_min[0];
      pOVar6->m_min[1] = local_68.m_rect.m_min[1];
    }
    bVar1 = false;
  }
  else {
    if (a_node->m_level != a_level) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0xb03,"","ON_RTree::InsertRectRec - bug in algorithm");
      return false;
    }
    local_68.m_rect.m_min[0] = a_rect->m_min[0];
    local_68.m_rect.m_min[1] = a_rect->m_min[1];
    local_68.m_rect.m_min[2] = a_rect->m_min[2];
    local_68.m_rect.m_max[0] = a_rect->m_max[0];
    local_68.m_rect.m_max[1] = a_rect->m_max[1];
    local_68.m_rect.m_max[2] = a_rect->m_max[2];
    local_68.field_1.m_id = a_id;
LAB_005b3291:
    bVar1 = AddBranch(this,&local_68,a_node,a_newNode);
  }
  return bVar1;
}

Assistant:

bool ON_RTree::InsertRectRec(ON_RTreeBBox* a_rect, ON__INT_PTR a_id, ON_RTreeNode* a_node, ON_RTreeNode** a_newNode, int a_level)
{
  int index;
  ON_RTreeBranch branch;
  ON_RTreeNode* otherNode;

  // Still above level for insertion, go down tree recursively
  if(a_node->m_level > a_level)
  {
    index = PickBranch(a_rect, a_node);
    if ( index < 0 )
    {
      return false;
    }
    if (!InsertRectRec(a_rect, a_id, a_node->m_branch[index].m_child, &otherNode, a_level))
    {
      // Child was not split
      a_node->m_branch[index].m_rect = CombineRectHelper(a_rect, &(a_node->m_branch[index].m_rect));
      return false;
    }
    else // Child was split
    {
      a_node->m_branch[index].m_rect = NodeCover(a_node->m_branch[index].m_child);
      branch.m_child = otherNode;
      branch.m_rect = NodeCover(otherNode);
      return AddBranch(&branch, a_node, a_newNode);
    }
  }
  else if(a_node->m_level == a_level) // Have reached level for insertion. Add rect, split if necessary
  {
    branch.m_rect = *a_rect;

    // The (ON_RTreeNode*) cast is safe because ON__INT_PTR == sizeof(void*)
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_PUSH
// Disable warning C4312: 'type cast' : conversion from 'ON__INT_PTR' to 'ON_RTreeNode *' of greater size
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4312 )
#endif
    branch.m_child = (ON_RTreeNode*)a_id;
#if defined(ON_COMPILER_MSC) && 4 == ON_SIZEOF_POINTER
#pragma ON_PRAGMA_WARNING_POP
#endif

    // Child field of leaves contains id of data record
    return AddBranch(&branch, a_node, a_newNode);
  }

  // We should never get here
  ON_ERROR("ON_RTree::InsertRectRec - bug in algorithm");
  return false;
}